

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  Nonnull<const_char_*> pcVar4;
  long v2;
  bool bVar5;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar3 = rep(this);
    uVar2 = pRVar3->allocated_size;
  }
  if ((int)uVar2 < iVar1) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar1,(long)(int)uVar2,"size() <= allocated_size()");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar3 = rep(this);
      uVar2 = pRVar3->allocated_size;
    }
    v2 = (long)this->capacity_proxy_ + 1;
    if ((int)v2 < (int)uVar2) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)(int)uVar2,v2,"allocated_size() <= Capacity()");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar5 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar3 = rep(this);
        bVar5 = this->capacity_proxy_ < pRVar3->allocated_size;
      }
      return bVar5;
    }
  }
  else {
    AllocatedSizeAtCapacity();
  }
  AllocatedSizeAtCapacity();
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }